

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O1

GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *
__thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
MemberReserve(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *this,SizeType newCapacity,MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator)

{
  uint uVar1;
  void *pvVar2;
  
  uVar1 = (this->data_).s.hashcode;
  if (uVar1 < newCapacity) {
    pvVar2 = MemoryPoolAllocator<rapidjson::CrtAllocator>::Realloc
                       (allocator,(void *)((ulong)(this->data_).s.str & 0xffffffffffff),
                        (ulong)uVar1 << 5,(ulong)newCapacity << 5);
    (this->data_).s.str = (Ch *)((ulong)(this->data_).f.flags << 0x30 | (ulong)pvVar2);
    (this->data_).s.hashcode = newCapacity;
  }
  return this;
}

Assistant:

GenericValue& MemberReserve(SizeType newCapacity, Allocator &allocator) {
        RAPIDJSON_ASSERT(IsObject());
        if (newCapacity > data_.o.capacity) {
            SetMembersPointer(reinterpret_cast<Member*>(allocator.Realloc(GetMembersPointer(), data_.o.capacity * sizeof(Member), newCapacity * sizeof(Member))));
            data_.o.capacity = newCapacity;
        }
        return *this;
    }